

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestMakeDirs::Run(BuildTestMakeDirs *this)

{
  Builder *this_00;
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  string err;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "build subdir/dir2/file: cat in1\n",(ManifestParserOptions)0x0);
  pTVar2 = g_current_test;
  iVar4 = g_current_test->assertion_failures_;
  if (iVar1 == iVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"subdir/dir2/file",&local_69);
    this_00 = &(this->super_BuildTest).builder_;
    pNVar5 = Builder::AddTarget(this_00,&local_48,&local_68);
    testing::Test::Check
              (pTVar2,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x39c,"builder_.AddTarget(\"subdir/dir2/file\", &err)");
    std::__cxx11::string::~string((string *)&local_48);
    pTVar2 = g_current_test;
    bVar3 = std::operator==("",&local_68);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x39e,"\"\" == err");
    pTVar2 = g_current_test;
    bVar3 = Builder::Build(this_00,&local_68);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x39f,"builder_.Build(&err)");
    pTVar2 = g_current_test;
    bVar3 = std::operator==("",&local_68);
    bVar3 = testing::Test::Check
                      (pTVar2,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x3a0,"\"\" == err");
    if (bVar3) {
      bVar3 = testing::Test::Check
                        (g_current_test,
                         (long)(this->super_BuildTest).fs_.directories_made_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_BuildTest).fs_.directories_made_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start == 0x40,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0x3a1,"2u == fs_.directories_made_.size()");
      pTVar2 = g_current_test;
      if (bVar3) {
        bVar3 = std::operator==("subdir",(this->super_BuildTest).fs_.directories_made_.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
        testing::Test::Check
                  (pTVar2,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x3a2,"\"subdir\" == fs_.directories_made_[0]");
        pTVar2 = g_current_test;
        bVar3 = std::operator==("subdir/dir2",
                                (this->super_BuildTest).fs_.directories_made_.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
        testing::Test::Check
                  (pTVar2,bVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x3a3,"\"subdir/dir2\" == fs_.directories_made_[1]");
        goto LAB_00128a0a;
      }
    }
    iVar4 = g_current_test->assertion_failures_;
  }
  g_current_test->assertion_failures_ = iVar4 + 1;
LAB_00128a0a:
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

TEST_F(BuildTest, MakeDirs) {
  string err;

#ifdef _WIN32
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
                                      "build subdir\\dir2\\file: cat in1\n"));
#else
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
                                      "build subdir/dir2/file: cat in1\n"));
#endif
  EXPECT_TRUE(builder_.AddTarget("subdir/dir2/file", &err));

  EXPECT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(2u, fs_.directories_made_.size());
  EXPECT_EQ("subdir", fs_.directories_made_[0]);
  EXPECT_EQ("subdir/dir2", fs_.directories_made_[1]);
}